

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

Canceler * __thiscall
kj::_::NullableValue<kj::Canceler>::emplace<>(NullableValue<kj::Canceler> *this)

{
  NullableValue<kj::Canceler> *this_local;
  
  if ((this->isSet & 1U) != 0) {
    this->isSet = false;
    dtor<kj::Canceler>(&(this->field_1).value);
  }
  ctor<kj::Canceler>(&(this->field_1).value);
  this->isSet = true;
  return (Canceler *)&this->field_1;
}

Assistant:

inline T& emplace(Params&&... params) {
    if (isSet) {
      isSet = false;
      dtor(value);
    }
    ctor(value, kj::fwd<Params>(params)...);
    isSet = true;
    return value;
  }